

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O2

void __thiscall Solution::mutate_inversion(Solution *this)

{
  ulong uVar1;
  Vehicle *this_00;
  _List_node_base *p_Var2;
  Point *pPVar3;
  int iVar4;
  mapped_type *pmVar5;
  difference_type __d;
  difference_type __d_2;
  _List_node_base *p_Var6;
  int iVar7;
  iterator __begin1;
  _List_node_base *p_Var8;
  int ec;
  int local_78;
  difference_type __d_1;
  iterator nit;
  Solution *local_60;
  list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> points_list;
  iterator nit2;
  iterator vit;
  
  vit._M_node = (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                _M_node.super__List_node_base._M_next;
  iVar4 = rand();
  std::__advance<std::_List_iterator<Vehicle*>,long>
            (&vit,(ulong)(long)iVar4 %
                  (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                  _M_node._M_size);
  this_00 = (Vehicle *)vit._M_node[1]._M_next;
  if ((this_00->nodes).
      super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
      ._M_impl._M_node._M_size < 3) {
    return;
  }
  iVar4 = rand();
  uVar1 = (ulong)(long)iVar4 %
          ((this_00->nodes).
           super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
           ._M_impl._M_node._M_size - 2) + 2;
  iVar4 = rand();
  __d_1 = (ulong)(long)iVar4 % uVar1;
  nit._M_node = (this_00->nodes).
                super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
  std::__advance<std::_List_iterator<std::shared_ptr<VehicleState>>,long>(&nit,__d_1);
  nit2._M_node = (this_00->nodes).
                 super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
  std::__advance<std::_List_iterator<std::shared_ptr<VehicleState>>,long>(&nit2,uVar1);
  p_Var6 = (_List_node_base *)&points_list;
  points_list.super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = p_Var6;
  points_list.super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = p_Var6;
  points_list.super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>.
  _M_impl._M_node._M_size = 0;
  while (p_Var2 = (nit._M_node)->_M_next, nit._M_node != nit2._M_node) {
    pPVar3 = (Point *)(p_Var2[1]._M_next)->_M_next;
    nit._M_node = p_Var2;
    local_60 = this;
    pmVar5 = std::__detail::
             _Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pPVar3->state,&local_60);
    local_78 = pmVar5->second;
    _ec = pPVar3;
    std::__cxx11::list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::
    push_back((list<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)p_Var6,
              (value_type *)&ec);
  }
  iVar4 = *(int *)&points_list.
                   super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
  nit._M_node = p_Var2;
  for (p_Var8 = points_list.
                super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var8 != p_Var6;
      p_Var8 = (((_List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_> *)
                &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    Vehicle::remove_node(this_00,iVar4);
  }
  iVar7 = 0;
  iVar4 = 2;
  while( true ) {
    if (p_Var6 == points_list.
                  super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next) goto LAB_001061d8;
    _ec = (Point *)((ulong)_ec & 0xffffffff00000000);
    Vehicle::add_node(this_00,(Point *)p_Var6->_M_prev[1]._M_next,(int)__d_1 + iVar7,&ec);
    if (ec != 0) break;
    p_Var6 = p_Var6->_M_prev;
    iVar4 = iVar4 + 1;
    iVar7 = iVar7 + 1;
  }
  _ec = (Point *)((ulong)_ec & 0xffffffff00000000);
  while (iVar4 = iVar4 + -1, 1 < iVar4) {
    Vehicle::remove_node(this_00,(int)__d_1);
  }
  p_Var6 = (_List_node_base *)&points_list;
  while (p_Var6 = (((_List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>
                     *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)&points_list) {
    Vehicle::add_node(this_00,(Point *)p_Var6[1]._M_next,*(int *)&p_Var6[1]._M_prev,&ec);
  }
LAB_001061d8:
  std::__cxx11::_List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>::
  _M_clear(&points_list.
            super__List_base<std::pair<Point_*,_int>,_std::allocator<std::pair<Point_*,_int>_>_>);
  return;
}

Assistant:

void Solution::mutate_inversion() {
    auto vit = vehicles.begin();
    std::advance(vit, rand() % vehicles.size());
    auto v1 = *vit;

    if (v1->nodes.size() < 3)
        return;
    auto range_max = rand() % (v1->nodes.size() - 2) + 2;
    auto range_min = rand() % range_max;

    auto nit = v1->nodes.begin();
    std::advance(nit, range_min);
    auto nit2 = v1->nodes.begin();
    std::advance(nit2, range_max);

    std::list<std::pair<Point *, int>> points_list;

    while (nit++ != nit2) {
        auto p = (*nit)->p;
        points_list.push_back(std::pair<Point *, int>(p, p->state[this].second));
        //v1->remove_node(p->state[this].second);//invalidate iterators
    }

    int remove_pos = (*points_list.begin()).second;
    for (auto pair: points_list) {
        v1->remove_node(remove_pos);
    }

    auto i = 0;
    for (auto rit = points_list.rbegin(); rit != points_list.rend(); ++rit) {
        auto p = (*rit).first;
        auto ec = 0;
        v1->add_node(p, range_min + i++, ec);
        if (ec != 0) {//Error, repair route
            ec = 0;
            while (--i > 0) {
                v1->remove_node(range_min);
            }
            for (auto pair: points_list) {
                v1->add_node(pair.first, pair.second, ec);
            }
            break;
        }
    }


}